

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgflusher.cc
# Opt level: O0

void bgflusher_deregister_file(filemgr *file)

{
  int iVar1;
  avl_node *paVar2;
  undefined8 *in_RDI;
  openfiles_elem *elem;
  openfiles_elem query;
  avl_node *a;
  avl_cmp_func *in_stack_fffffffffffffac8;
  avl_node *in_stack_fffffffffffffad0;
  avl_tree *in_stack_fffffffffffffad8;
  avl_node *in_stack_fffffffffffffae8;
  avl_tree *in_stack_fffffffffffffaf0;
  
  if (bgflusher_initialized != '\0') {
    strcpy(&stack0xfffffffffffffac8,(char *)*in_RDI);
    pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
    paVar2 = avl_search(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                        in_stack_fffffffffffffac8);
    if (paVar2 != (avl_node *)0x0) {
      iVar1 = *(int *)&paVar2[-1].left + -1;
      *(int *)&paVar2[-1].left = iVar1;
      if (iVar1 == 0) {
        if (((ulong)paVar2[-1].left & 0x100000000) == 0) {
          avl_remove(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
          free(paVar2 + -0x36);
        }
        else {
          paVar2[-0xc].right = (avl_node *)0x0;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
  }
  return;
}

Assistant:

void bgflusher_deregister_file(struct filemgr *file)
{
    if (!bgflusher_initialized) return;

    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    strcpy(query.filename, file->filename);
    mutex_lock(&bgf_lock);
    a = avl_search(&openfiles, &query.avl, _bgflusher_cmp);
    if (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        if ((--elem->register_count) == 0) {
            // if no handle refers this file
            if (elem->background_flush_in_progress) {
                // Background flusher is writing blocks while the file is closed.
                // Do not remove 'elem' for now. The 'elem' will be automatically
                // removed once background flushing is done. Set elem->file
                // to NULL to indicate this intent.
                elem->file = NULL;
            } else {
                // remove from the tree
                avl_remove(&openfiles, &elem->avl);
                free(elem);
            }
        }
    }
    mutex_unlock(&bgf_lock);
}